

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.cpp
# Opt level: O3

HANDLE GetProcessHeap(void)

{
  int iVar1;
  
  if (GetProcessHeap::was_pal_initialized == '\0') {
    iVar1 = __cxa_guard_acquire(&GetProcessHeap::was_pal_initialized);
    if (iVar1 != 0) {
      GetProcessHeap::was_pal_initialized = PAL_Initialize_Check_Once();
      __cxa_guard_release(&GetProcessHeap::was_pal_initialized);
    }
  }
  if (GetProcessHeap::was_pal_initialized == false) {
    fprintf(_stderr,"] %s %s:%d","GetProcessHeap",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/memory/heap.cpp"
            ,0xae);
    fprintf(_stderr,"Expression: was_pal_initialized\n");
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return (HANDLE)0x1020304;
  }
  abort();
}

Assistant:

HANDLE
PALAPI
GetProcessHeap(
	       VOID)
{
    HANDLE ret;
#ifdef DEBUG
    static bool was_pal_initialized = PAL_Initialize_Check_Once();
    _ASSERTE(was_pal_initialized);
#endif

    PERF_ENTRY(GetProcessHeap);
    ENTRY("GetProcessHeap()\n");

#ifdef __APPLE__
#if HEAP_HANDLES_ARE_REAL_HANDLES
#error
#else
    malloc_zone_t *pZone = malloc_default_zone();
    ret = (HANDLE)pZone;
#ifdef CACHE_HEAP_ZONE
    if (s_pExecutableHeap == NULL)
    {
        s_pExecutableHeap = pZone;
        TRACE("s_pExecutableHeap is %p (process heap).\n", s_pExecutableHeap);
    }
#endif // CACHE_HEAP_ZONE
#endif // HEAP_HANDLES_ARE_REAL_HANDLES
#else
    ret = (HANDLE) DUMMY_HEAP;
#endif

    LOGEXIT("GetProcessHeap returning HANDLE %p\n", ret);
    PERF_EXIT(GetProcessHeap);
    return ret;
}